

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

bool __thiscall
duckdb::StrpTimeFormat::TryParseDate
          (StrpTimeFormat *this,string_t input,date_t *result,string *error_message)

{
  bool bVar1;
  ParseResult parse_result;
  string sStack_b8;
  ParseResult local_98;
  
  local_98.tz._M_dataplus._M_p = (pointer)&local_98.tz.field_2;
  local_98.tz._M_string_length = 0;
  local_98.tz.field_2._M_local_buf[0] = '\0';
  local_98.error_message._M_dataplus._M_p = (pointer)&local_98.error_message.field_2;
  local_98.error_message._M_string_length = 0;
  local_98.error_message.field_2._M_local_buf[0] = '\0';
  local_98.error_position.index = 0xffffffffffffffff;
  bVar1 = Parse(this,input,&local_98,false);
  if (bVar1) {
    bVar1 = ParseResult::TryToDate(&local_98,result);
  }
  else {
    ParseResult::FormatError
              (&sStack_b8,&local_98,input,&(this->super_StrTimeFormat).format_specifier);
    ::std::__cxx11::string::operator=((string *)error_message,(string *)&sStack_b8);
    ::std::__cxx11::string::~string((string *)&sStack_b8);
    bVar1 = false;
  }
  ParseResult::~ParseResult(&local_98);
  return bVar1;
}

Assistant:

bool StrpTimeFormat::TryParseDate(string_t input, date_t &result, string &error_message) const {
	ParseResult parse_result;
	if (!Parse(input, parse_result)) {
		error_message = parse_result.FormatError(input, format_specifier);
		return false;
	}
	return parse_result.TryToDate(result);
}